

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ExternInterfaceMethodSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExternInterfaceMethodSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,FunctionPrototypeSyntax *args_3,Token *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  ExternInterfaceMethodSyntax *this_00;
  
  this_00 = (ExternInterfaceMethodSyntax *)allocate(this,0x88,8);
  TVar4 = args_1->kind;
  uVar5 = args_1->field_0x2;
  NVar6.raw = (args_1->numFlags).raw;
  uVar7 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar8 = args_2->kind;
  uVar9 = args_2->field_0x2;
  NVar10.raw = (args_2->numFlags).raw;
  uVar11 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar12 = args_4->kind;
  uVar13 = args_4->field_0x2;
  NVar14.raw = (args_4->numFlags).raw;
  uVar15 = args_4->rawLen;
  pIVar3 = args_4->info;
  slang::syntax::MemberSyntax::MemberSyntax((MemberSyntax *)this_00,ExternInterfaceMethod,args);
  (this_00->externKeyword).kind = TVar4;
  (this_00->externKeyword).field_0x2 = uVar5;
  (this_00->externKeyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (this_00->externKeyword).rawLen = uVar7;
  (this_00->externKeyword).info = pIVar1;
  (this_00->forkJoin).kind = TVar8;
  (this_00->forkJoin).field_0x2 = uVar9;
  (this_00->forkJoin).numFlags = (NumericTokenFlags)NVar10.raw;
  (this_00->forkJoin).rawLen = uVar11;
  (this_00->forkJoin).info = pIVar2;
  (this_00->prototype).ptr = args_3;
  (this_00->semi).kind = TVar12;
  (this_00->semi).field_0x2 = uVar13;
  (this_00->semi).numFlags = (NumericTokenFlags)NVar14.raw;
  (this_00->semi).rawLen = uVar15;
  (this_00->semi).info = pIVar3;
  (args_3->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }